

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha_blocks_ref.c
# Opt level: O0

void hchacha_ref(uint8_t *key,uint8_t *iv,uint8_t *out,size_t rounds)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  long in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint32_t t;
  uint32_t x [16];
  uint local_68;
  uint32_t local_64;
  uint32_t local_60;
  uint32_t local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  long local_20;
  
  local_68 = 0x61707865;
  local_64 = 0x3320646e;
  local_60 = 0x79622d32;
  local_5c = 0x6b206574;
  local_58 = U8TO32(in_RDI);
  local_54 = U8TO32(in_RDI + 4);
  local_50 = U8TO32(in_RDI + 8);
  local_4c = U8TO32(in_RDI + 0xc);
  local_48 = U8TO32(in_RDI + 0x10);
  local_44 = U8TO32(in_RDI + 0x14);
  local_40 = U8TO32(in_RDI + 0x18);
  local_3c = U8TO32(in_RDI + 0x1c);
  local_38 = U8TO32(in_RSI);
  local_34 = U8TO32(in_RSI + 4);
  local_30 = U8TO32(in_RSI + 8);
  local_2c = U8TO32(in_RSI + 0xc);
  local_20 = in_RCX;
  do {
    uVar1 = ROTL32(local_38 ^ local_58 + local_68,0x10);
    uVar2 = ROTL32(local_58 ^ uVar1 + local_48,0xc);
    local_68 = uVar2 + local_58 + local_68;
    uVar3 = ROTL32(uVar1 ^ local_68,8);
    uVar4 = uVar3 + uVar1 + local_48;
    uVar1 = ROTL32(uVar2 ^ uVar4,7);
    uVar2 = ROTL32(local_34 ^ local_54 + local_64,0x10);
    uVar5 = ROTL32(local_54 ^ uVar2 + local_44,0xc);
    uVar6 = uVar5 + local_54 + local_64;
    uVar7 = ROTL32(uVar2 ^ uVar6,8);
    uVar8 = uVar7 + uVar2 + local_44;
    uVar2 = ROTL32(uVar5 ^ uVar8,7);
    uVar5 = ROTL32(local_30 ^ local_50 + local_60,0x10);
    uVar9 = ROTL32(local_50 ^ uVar5 + local_40,0xc);
    uVar10 = uVar9 + local_50 + local_60;
    uVar11 = ROTL32(uVar5 ^ uVar10,8);
    uVar12 = uVar11 + uVar5 + local_40;
    uVar5 = ROTL32(uVar9 ^ uVar12,7);
    uVar9 = ROTL32(local_2c ^ local_4c + local_5c,0x10);
    uVar13 = ROTL32(local_4c ^ uVar9 + local_3c,0xc);
    uVar14 = uVar13 + local_4c + local_5c;
    uVar15 = ROTL32(uVar9 ^ uVar14,8);
    uVar16 = uVar15 + uVar9 + local_3c;
    uVar9 = ROTL32(uVar13 ^ uVar16,7);
    local_68 = uVar2 + local_68;
    uVar13 = ROTL32(uVar15 ^ local_68,0x10);
    uVar12 = uVar13 + uVar12;
    uVar2 = ROTL32(uVar2 ^ uVar12,0xc);
    local_68 = uVar2 + local_68;
    local_2c = ROTL32(uVar13 ^ local_68,8);
    local_40 = local_2c + uVar12;
    local_54 = ROTL32(uVar2 ^ local_40,7);
    uVar6 = uVar5 + uVar6;
    uVar2 = ROTL32(uVar3 ^ uVar6,0x10);
    uVar16 = uVar2 + uVar16;
    uVar3 = ROTL32(uVar5 ^ uVar16,0xc);
    local_64 = uVar3 + uVar6;
    local_38 = ROTL32(uVar2 ^ local_64,8);
    local_3c = local_38 + uVar16;
    local_50 = ROTL32(uVar3 ^ local_3c,7);
    uVar10 = uVar9 + uVar10;
    uVar2 = ROTL32(uVar7 ^ uVar10,0x10);
    uVar4 = uVar2 + uVar4;
    uVar3 = ROTL32(uVar9 ^ uVar4,0xc);
    local_60 = uVar3 + uVar10;
    local_34 = ROTL32(uVar2 ^ local_60,8);
    local_48 = local_34 + uVar4;
    local_4c = ROTL32(uVar3 ^ local_48,7);
    uVar14 = uVar1 + uVar14;
    uVar2 = ROTL32(uVar11 ^ uVar14,0x10);
    uVar8 = uVar2 + uVar8;
    uVar1 = ROTL32(uVar1 ^ uVar8,0xc);
    local_5c = uVar1 + uVar14;
    local_30 = ROTL32(uVar2 ^ local_5c,8);
    local_44 = local_30 + uVar8;
    local_58 = ROTL32(uVar1 ^ local_44,7);
    local_20 = local_20 + -2;
  } while (local_20 != 0);
  U32TO8(in_RDX,local_68);
  U32TO8(in_RDX + 4,local_64);
  U32TO8(in_RDX + 8,local_60);
  U32TO8(in_RDX + 0xc,local_5c);
  U32TO8(in_RDX + 0x10,local_38);
  U32TO8(in_RDX + 0x14,local_34);
  U32TO8(in_RDX + 0x18,local_30);
  U32TO8(in_RDX + 0x1c,local_2c);
  return;
}

Assistant:

void
hchacha_ref(const uint8_t key[32], const uint8_t iv[16], uint8_t out[32], size_t rounds) {
    uint32_t x[16];
    uint32_t t;

    x[0] = chacha_constants[0];
    x[1] = chacha_constants[1];
    x[2] = chacha_constants[2];
    x[3] = chacha_constants[3];
    x[4] = U8TO32(key + 0);
    x[5] = U8TO32(key + 4);
    x[6] = U8TO32(key + 8);
    x[7] = U8TO32(key + 12);
    x[8] = U8TO32(key + 16);
    x[9] = U8TO32(key + 20);
    x[10] = U8TO32(key + 24);
    x[11] = U8TO32(key + 28);
    x[12] = U8TO32(iv + 0);
    x[13] = U8TO32(iv + 4);
    x[14] = U8TO32(iv + 8);
    x[15] = U8TO32(iv + 12);

    do {
        doubleround()
        rounds -= 2;
    } while (rounds);

    /* indices for the chacha constant */
    U32TO8(out + 0, x[0]);
    U32TO8(out + 4, x[1]);
    U32TO8(out + 8, x[2]);
    U32TO8(out + 12, x[3]);

    /* indices for the iv */
    U32TO8(out + 16, x[12]);
    U32TO8(out + 20, x[13]);
    U32TO8(out + 24, x[14]);
    U32TO8(out + 28, x[15]);
}